

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_optional.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::TestProto3Optional::ByteSizeLong(TestProto3Optional *this)

{
  uint uVar1;
  type_conflict tVar2;
  type_conflict tVar3;
  int32_t iVar4;
  uint32_t value;
  TestProto3Optional_NestedEnum value_00;
  uint32_t *puVar5;
  string *psVar6;
  size_t sVar7;
  int64_t iVar8;
  uint64_t value_01;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestProto3Optional *this_;
  TestProto3Optional *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar5 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar5;
  tVar2 = absl::lts_20250127::popcount<unsigned_int>(uVar1 & 0x13000);
  tVar3 = absl::lts_20250127::popcount<unsigned_int>(uVar1 & 0xc800);
  sStack_58 = (long)(int)((uint)((uVar1 & 0x20000) != 0) << 1) +
              (long)(tVar3 * 5) + (long)(tVar2 * 9);
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar6 = _internal_optional_string_abi_cxx11_(this);
      sVar7 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      sStack_58 = sVar7 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      psVar6 = _internal_optional_bytes_abi_cxx11_(this);
      sVar7 = google::protobuf::internal::WireFormatLite::BytesSize(psVar6);
      sStack_58 = sVar7 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      psVar6 = _internal_optional_cord_abi_cxx11_(this);
      sVar7 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      sStack_58 = sVar7 + 2 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      sVar7 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::TestProto3Optional_NestedMessage>
                        ((this->field_0)._impl_.optional_nested_message_);
      sStack_58 = sVar7 + 2 + sStack_58;
    }
    if ((uVar1 & 0x10) != 0) {
      sVar7 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::TestProto3Optional_NestedMessage>
                        ((this->field_0)._impl_.lazy_nested_message_);
      sStack_58 = sVar7 + 2 + sStack_58;
    }
    if ((uVar1 & 0x20) != 0) {
      iVar8 = _internal_optional_int64(this);
      sVar7 = google::protobuf::internal::WireFormatLite::Int64SizePlusOne(iVar8);
      sStack_58 = sVar7 + sStack_58;
    }
    if ((uVar1 & 0x40) != 0) {
      iVar4 = _internal_optional_int32(this);
      sVar7 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar4);
      sStack_58 = sVar7 + sStack_58;
    }
    if ((uVar1 & 0x80) != 0) {
      value = _internal_optional_uint32(this);
      sVar7 = google::protobuf::internal::WireFormatLite::UInt32SizePlusOne(value);
      sStack_58 = sVar7 + sStack_58;
    }
  }
  if ((uVar1 & 0x700) != 0) {
    if ((uVar1 & 0x100) != 0) {
      value_01 = _internal_optional_uint64(this);
      sVar7 = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(value_01);
      sStack_58 = sVar7 + sStack_58;
    }
    if ((uVar1 & 0x200) != 0) {
      iVar8 = _internal_optional_sint64(this);
      sVar7 = google::protobuf::internal::WireFormatLite::SInt64SizePlusOne(iVar8);
      sStack_58 = sVar7 + sStack_58;
    }
    if ((uVar1 & 0x400) != 0) {
      iVar4 = _internal_optional_sint32(this);
      sVar7 = google::protobuf::internal::WireFormatLite::SInt32SizePlusOne(iVar4);
      sStack_58 = sVar7 + sStack_58;
    }
  }
  if ((uVar1 & 0x1c0000) != 0) {
    if ((uVar1 & 0x40000) != 0) {
      value_00 = _internal_optional_nested_enum(this);
      sVar7 = google::protobuf::internal::WireFormatLite::EnumSize(value_00);
      sStack_58 = sVar7 + 2 + sStack_58;
    }
    if (((uVar1 & 0x80000) != 0) && (iVar8 = _internal_singular_int64(this), iVar8 != 0)) {
      iVar8 = _internal_singular_int64(this);
      sVar7 = google::protobuf::internal::WireFormatLite::Int64Size(iVar8);
      sStack_58 = sVar7 + 2 + sStack_58;
    }
    if (((uVar1 & 0x100000) != 0) && (iVar4 = _internal_singular_int32(this), iVar4 != 0)) {
      iVar4 = _internal_singular_int32(this);
      sVar7 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      sStack_58 = sVar7 + 2 + sStack_58;
    }
  }
  sVar7 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t TestProto3Optional::ByteSizeLong() const {
  const TestProto3Optional& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestProto3Optional)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += ::absl::popcount(0x00013000u & cached_has_bits) * 9;
  total_size += ::absl::popcount(0x0000c800u & cached_has_bits) * 5;
  total_size += static_cast<bool>(0x00020000u & cached_has_bits) * 2;
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // optional string optional_string = 14;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string());
    }
    // optional bytes optional_bytes = 15;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_optional_bytes());
    }
    // optional string optional_cord = 16 [ctype = CORD];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_cord());
    }
    // optional .proto2_unittest.TestProto3Optional.NestedMessage optional_nested_message = 18;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_nested_message_);
    }
    // optional .proto2_unittest.TestProto3Optional.NestedMessage lazy_nested_message = 19 [lazy = true];
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.lazy_nested_message_);
    }
    // optional int64 optional_int64 = 2;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
          this_._internal_optional_int64());
    }
    // optional int32 optional_int32 = 1;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_optional_int32());
    }
    // optional uint32 optional_uint32 = 3;
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt32SizePlusOne(
          this_._internal_optional_uint32());
    }
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    // optional uint64 optional_uint64 = 4;
    if ((cached_has_bits & 0x00000100u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
          this_._internal_optional_uint64());
    }
    // optional sint64 optional_sint64 = 6;
    if ((cached_has_bits & 0x00000200u) != 0) {
      total_size += ::_pbi::WireFormatLite::SInt64SizePlusOne(
          this_._internal_optional_sint64());
    }
    // optional sint32 optional_sint32 = 5;
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += ::_pbi::WireFormatLite::SInt32SizePlusOne(
          this_._internal_optional_sint32());
    }
  }
  if ((cached_has_bits & 0x001c0000u) != 0) {
    // optional .proto2_unittest.TestProto3Optional.NestedEnum optional_nested_enum = 21;
    if ((cached_has_bits & 0x00040000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_nested_enum());
    }
    // int64 singular_int64 = 23;
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (this_._internal_singular_int64() != 0) {
        total_size += 2 + ::_pbi::WireFormatLite::Int64Size(
                                        this_._internal_singular_int64());
      }
    }
    // int32 singular_int32 = 22;
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (this_._internal_singular_int32() != 0) {
        total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                        this_._internal_singular_int32());
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}